

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O2

void Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1stopeps_1set
               (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_,jdouble jarg2)

{
  if (jarg1 != 0) {
    *(jdouble *)(jarg1 + 0x80) = jarg2;
  }
  return;
}

Assistant:

SWIGEXPORT void JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1stopeps_1set(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_, jdouble jarg2) {
  opt_s *arg1 = (opt_s *) 0 ;
  double arg2 ;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  arg2 = (double)jarg2; 
  if (arg1) (arg1)->stopeps = arg2;
}